

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_fader_config ma_fader_config_init(ma_format format,ma_uint32 channels,ma_uint32 sampleRate)

{
  ma_fader_config mVar1;
  ma_uint32 sampleRate_local;
  ma_uint32 channels_local;
  ma_format format_local;
  ma_fader_config config;
  
  config.channels = 0xc;
  config.sampleRate = 0;
  memset(&channels_local,0,0xc);
  mVar1.channels = channels;
  mVar1.format = format;
  mVar1.sampleRate = sampleRate;
  return mVar1;
}

Assistant:

MA_API ma_fader_config ma_fader_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate)
{
    ma_fader_config config;

    MA_ZERO_OBJECT(&config);
    config.format     = format;
    config.channels   = channels;
    config.sampleRate = sampleRate;

    return config;
}